

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCataloger.cpp
# Opt level: O0

Action __thiscall
psy::C::NameCataloger::visitTranslationUnit(NameCataloger *this,TranslationUnitSyntax *node)

{
  pointer pNVar1;
  DeclarationListSyntax *local_20;
  DeclarationListSyntax *iter;
  TranslationUnitSyntax *node_local;
  NameCataloger *this_local;
  
  pNVar1 = std::unique_ptr<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>::
           operator->(&this->catalog_);
  NameCatalog::indexNodeAndMarkAsEncloser(pNVar1,&node->super_SyntaxNode);
  for (local_20 = TranslationUnitSyntax::declarations(node);
      local_20 != (DeclarationListSyntax *)0x0;
      local_20 = (local_20->
                 super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                 ).
                 super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                 .next) {
    SyntaxVisitor::visit
              (&this->super_SyntaxVisitor,
               &((local_20->
                 super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                 ).
                 super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                .value)->super_SyntaxNode);
  }
  pNVar1 = std::unique_ptr<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>::
           operator->(&this->catalog_);
  NameCatalog::dropEncloser(pNVar1);
  return Skip;
}

Assistant:

SyntaxVisitor::Action NameCataloger::visitTranslationUnit(const TranslationUnitSyntax* node)
{
    catalog_->indexNodeAndMarkAsEncloser(node);
    for (auto iter = node->declarations(); iter; iter = iter->next)
        visit(iter->value);
    catalog_->dropEncloser();

#ifdef DBG_CATALOG
    std::cout << *catalog_ << std::endl;
#endif

    return Action::Skip;
}